

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib567.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    lVar2 = curl_easy_init();
    if (lVar2 != 0) {
      lVar3 = 0;
      iVar1 = curl_easy_setopt(lVar2,0x272d,_stdout);
      if (iVar1 == 0) {
        lVar3 = 0;
        iVar1 = curl_easy_setopt(lVar2,0x2711,_stdout);
        if (iVar1 == 0) {
          lVar3 = 0;
          iVar1 = curl_easy_setopt(lVar2,0x2712,URL);
          if (iVar1 == 0) {
            lVar3 = 0;
            iVar1 = curl_easy_setopt(lVar2,0x27cf,URL);
            if (iVar1 == 0) {
              lVar3 = 0;
              iVar1 = curl_easy_setopt(lVar2,0xbd,1);
              if (iVar1 == 0) {
                lVar3 = 0;
                iVar1 = curl_easy_setopt(lVar2,0x2722,"test567");
                if (iVar1 == 0) {
                  lVar3 = curl_slist_append(0,"Test-Number: 567");
                  iVar1 = curl_easy_setopt(lVar2,0x2727,lVar3);
                  if (iVar1 == 0) {
                    iVar1 = curl_easy_perform(lVar2);
                  }
                }
              }
            }
          }
        }
      }
      if (lVar3 != 0) {
        curl_slist_free_all(lVar3);
      }
      curl_easy_cleanup(lVar2);
      curl_global_cleanup();
      return iVar1;
    }
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    curl_global_cleanup();
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
  }
  return 0x7e;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;
  struct curl_slist *custom_headers = NULL;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* Dump data to stdout for protocol verification */
  test_setopt(curl, CURLOPT_HEADERDATA, stdout);
  test_setopt(curl, CURLOPT_WRITEDATA, stdout);

  test_setopt(curl, CURLOPT_URL, URL);
  test_setopt(curl, CURLOPT_RTSP_STREAM_URI, URL);
  test_setopt(curl, CURLOPT_RTSP_REQUEST, CURL_RTSPREQ_OPTIONS);
  test_setopt(curl, CURLOPT_USERAGENT, "test567");

  custom_headers = curl_slist_append(custom_headers, "Test-Number: 567");
  test_setopt(curl, CURLOPT_RTSPHEADER, custom_headers);

  res = curl_easy_perform(curl);

test_cleanup:

  if(custom_headers)
    curl_slist_free_all(custom_headers);
  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}